

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::Utils::Buffer::SubData
          (Buffer *this,GLintptr offset,GLsizeiptr size,GLvoid *data)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLvoid *data_local;
  GLsizeiptr size_local;
  GLintptr offset_local;
  Buffer *this_local;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  SubData((Functions *)CONCAT44(extraout_var,iVar1),this->m_buffer,offset,size,data);
  return;
}

Assistant:

void Buffer::SubData(glw::GLintptr offset, glw::GLsizeiptr size, glw::GLvoid* data)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	SubData(gl, m_buffer, offset, size, data);
}